

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtree.c
# Opt level: O1

uint32 leaf_mean_vars(dtree_node_t *node,pset_t *pset,float32 ****means,float32 ****vars,
                     uint32 *node_id,uint32 n_state,uint32 n_stream,uint32 *veclen,uint32 off)

{
  uint uVar1;
  float32 *pfVar2;
  float32 *pfVar3;
  float32 *pfVar4;
  float32 *pfVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  for (; (node->y != (dtree_node_t *)0x0 || (node->n != (dtree_node_str *)0x0)); node = node->n) {
    off = leaf_mean_vars(node->y,pset,means,vars,node_id,n_state,n_stream,veclen,off);
  }
  node_id[off] = node->node_id;
  if (n_state != 0) {
    uVar7 = 0;
    do {
      if (n_stream != 0) {
        uVar8 = 0;
        do {
          uVar1 = veclen[uVar8];
          if ((ulong)uVar1 != 0) {
            pfVar2 = node->means[uVar7][uVar8];
            pfVar3 = means[off][uVar7][uVar8];
            pfVar4 = node->vars[uVar7][uVar8];
            pfVar5 = vars[off][uVar7][uVar8];
            uVar6 = 0;
            do {
              pfVar3[uVar6] = pfVar2[uVar6];
              pfVar5[uVar6] = pfVar4[uVar6];
              uVar6 = uVar6 + 1;
            } while (uVar1 != uVar6);
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 != n_stream);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != n_state);
  }
  return off + 1;
}

Assistant:

uint32
leaf_mean_vars(dtree_node_t *node,
	       pset_t *pset,
	       float32 ****means,
	       float32 ****vars,
	       uint32 *node_id,
	       uint32 n_state,
	       uint32 n_stream,
	       uint32 *veclen,
	       uint32 off)
{
    uint32 i, j, k;

    if (IS_LEAF(node)) {
	node_id[off] = node->node_id;

	for (i = 0; i < n_state; i++) {
	    for (j = 0; j < n_stream; j++) {
		for (k = 0; k < veclen[j]; k++) {
                    means[off][i][j][k] = node->means[i][j][k];
                    vars[off][i][j][k] = node->vars[i][j][k];
		}
	    }
	}

	return ++off;
    }
    else {
	off = leaf_mean_vars(node->y,
			pset,
			means,
                        vars,
			node_id,
			n_state,
			n_stream,
			veclen,
			off);
	off = leaf_mean_vars(node->n,
			pset,
			means,
                        vars,
			node_id,
			n_state,
			n_stream,
			veclen,
			off);
	return off;
    }
}